

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::(anonymous_namespace)::TryConvertFacevaryingToVertexInt<std::array<int,4ul>>
               (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *src,
               vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  uint *puVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  const_reference pvVar9;
  array<int,_4UL> *__s;
  reference ppVar10;
  reference pvVar11;
  pair<const_unsigned_int,_std::array<int,_4UL>_> *v;
  iterator __end0;
  iterator __begin0;
  unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
  *__range3;
  ulong uStack_70;
  uint32_t vidx;
  size_t i;
  undefined1 local_60 [4];
  uint32_t max_vidx;
  unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
  vdata;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *dst_local;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *src_local;
  
  if (dst == (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)0x0) {
    src_local._7_1_ = false;
  }
  else {
    vdata._M_h._M_single_bucket = (__node_base_ptr)faceVertexIndices;
    sVar3 = ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::size(src);
    sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       vdata._M_h._M_single_bucket);
    if (sVar3 == sVar4) {
      sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         vdata._M_h._M_single_bucket);
      if (sVar3 < 3) {
        src_local._7_1_ = false;
      }
      else {
        ::std::
        unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
        ::unordered_map((unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
                         *)local_60);
        i._4_4_ = 0;
        for (uStack_70 = 0; uVar1 = uStack_70,
            sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               vdata._M_h._M_single_bucket), uVar1 < sVar3;
            uStack_70 = uStack_70 + 1) {
          pvVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              vdata._M_h._M_single_bucket,uStack_70);
          __range3._4_4_ = *pvVar5;
          puVar6 = ::std::max<unsigned_int>((uint *)((long)&__range3 + 4),(uint *)((long)&i + 4));
          i._4_4_ = *puVar6;
          sVar7 = ::std::
                  unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
                  ::count((unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
                           *)local_60,(key_type *)((long)&__range3 + 4));
          if (sVar7 == 0) {
            pvVar9 = ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                     operator[](src,uStack_70);
            pmVar8 = ::std::
                     unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
                     ::operator[]((unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
                                   *)local_60,(key_type *)((long)&__range3 + 4));
            *(undefined8 *)pmVar8->_M_elems = *(undefined8 *)pvVar9->_M_elems;
            *(undefined8 *)(pmVar8->_M_elems + 2) = *(undefined8 *)(pvVar9->_M_elems + 2);
          }
          else {
            pmVar8 = ::std::
                     unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
                     ::operator[]((unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
                                   *)local_60,(key_type *)((long)&__range3 + 4));
            pvVar9 = ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                     operator[](src,uStack_70);
            bVar2 = math::is_close(pmVar8,pvVar9);
            if (!bVar2) {
              src_local._7_1_ = false;
              goto LAB_00500742;
            }
          }
        }
        ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
                  (dst,(ulong)(i._4_4_ + 1));
        __s = ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::data(dst)
        ;
        memset(__s,0,(ulong)(i._4_4_ + 1) << 4);
        __end0 = ::std::
                 unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
                 ::begin((unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
                          *)local_60);
        v = (pair<const_unsigned_int,_std::array<int,_4UL>_> *)
            ::std::
            unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
            ::end((unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
                   *)local_60);
        while (bVar2 = ::std::__detail::operator!=
                                 (&__end0.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_false>
                                  ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_false>
                                    *)&v), bVar2) {
          ppVar10 = ::std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_false,_false>
                    ::operator*(&__end0);
          pvVar11 = ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                    operator[](dst,(ulong)ppVar10->first);
          *(undefined8 *)pvVar11->_M_elems = *(undefined8 *)(ppVar10->second)._M_elems;
          *(undefined8 *)(pvVar11->_M_elems + 2) = *(undefined8 *)((ppVar10->second)._M_elems + 2);
          ::std::__detail::
          _Node_iterator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_false,_false>::
          operator++(&__end0);
        }
        src_local._7_1_ = true;
LAB_00500742:
        __range3._0_4_ = 1;
        ::std::
        unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_std::array<int,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>_>
                          *)local_60);
      }
    }
    else {
      src_local._7_1_ = false;
    }
  }
  return src_local._7_1_;
}

Assistant:

bool TryConvertFacevaryingToVertexInt(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices) {
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i])) {
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}